

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_ez(char *hash,char *data,size_t len)

{
  undefined1 *in_RDI;
  int i;
  uchar hval [32];
  int HASH_BYTES;
  sha256_ctx ctx;
  undefined7 in_stack_ffffffffffffff48;
  uchar in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar1;
  sha256_ctx *in_stack_ffffffffffffff60;
  unsigned_long in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  sha256_ctx local_80;
  undefined1 *local_8;
  
  local_8 = in_RDI;
  sha256_begin(&local_80);
  sha256_hash(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  sha256_end((uchar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (sha256_ctx *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 1) {
    byte_to_xdigits((char *)CONCAT44(iVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4f);
    local_8 = local_8 + 2;
  }
  *local_8 = 0;
  return;
}

Assistant:

void sha256_ez(char *hash, const char *data, size_t len)
{
    sha256_ctx ctx;
    const int HASH_BYTES = 32;
    unsigned char hval[HASH_BYTES];

    /* calculate the hash in binary format */
    sha256_begin(&ctx);
    sha256_hash((const unsigned char *)data, len, &ctx);
    sha256_end(hval, &ctx);

    /* convert the binary hash to printable hex digits */
    for (int i = 0 ; i < HASH_BYTES ; ++i, hash += 2)
        byte_to_xdigits(hash, hval[i]);

    /* null-terminate the string */
    *hash = '\0';
}